

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

_Bool do_vfm_dp(DisasContext_conflict1 *s,arg_VFMA_dp *a,_Bool neg_n,_Bool neg_d)

{
  uint uVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  TCGv_i64 var;
  TCGv_i64 var_00;
  TCGv_i64 var_01;
  TCGv_ptr pTVar3;
  _Bool _Var4;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *ret;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if ((((s->isar->mvfr1 < 0x10000000) || (uVar1 = s->isar->mvfr0, (uVar1 & 0xf00) == 0)) ||
      (s->vec_len != 0)) ||
     ((s->vec_stride != 0 ||
      ((tcg_ctx = s->uc->tcg_ctx, (uVar1 & 0xe) == 0 && (((a->vn | a->vd | a->vm) & 0x10U) != 0)))))
     ) {
    _Var4 = false;
  }
  else {
    _Var2 = vfp_access_check(s);
    _Var4 = true;
    if (_Var2) {
      var = tcg_temp_new_i64(tcg_ctx);
      var_00 = tcg_temp_new_i64(tcg_ctx);
      var_01 = tcg_temp_new_i64(tcg_ctx);
      neon_load_reg64(tcg_ctx,var,a->vn);
      neon_load_reg64(tcg_ctx,var_00,a->vm);
      if (neg_n) {
        gen_helper_vfp_negd(tcg_ctx,var,var);
      }
      neon_load_reg64(tcg_ctx,var_01,a->vd);
      if (neg_d) {
        gen_helper_vfp_negd(tcg_ctx,var_01,var_01);
      }
      pTVar3 = get_fpstatus_ptr_aarch64(tcg_ctx,0);
      ret = (TCGTemp *)(var_01 + (long)tcg_ctx);
      local_58 = (TCGTemp *)(var + (long)tcg_ctx);
      local_50 = (TCGTemp *)(var_00 + (long)tcg_ctx);
      local_48 = ret;
      local_40 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_muladdd_aarch64,ret,4,&local_58);
      neon_store_reg64(tcg_ctx,var_01,a->vd);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_00 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,ret);
    }
  }
  return _Var4;
}

Assistant:

static bool do_vfm_dp(DisasContext *s, arg_VFMA_dp *a, bool neg_n, bool neg_d)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /*
     * VFNMA : fd = muladd(-fd,  fn, fm)
     * VFNMS : fd = muladd(-fd, -fn, fm)
     * VFMA  : fd = muladd( fd,  fn, fm)
     * VFMS  : fd = muladd( fd, -fn, fm)
     *
     * These are fused multiply-add, and must be done as one floating
     * point operation with no rounding between the multiplication and
     * addition steps.  NB that doing the negations here as separate
     * steps is correct : an input NaN should come out with its sign
     * bit flipped if it is a negated-input.
     */
    TCGv_ptr fpst;
    TCGv_i64 vn, vm, vd;

    /*
     * Present in VFPv4 only.
     * Note that we can't rely on the SIMDFMAC check alone, because
     * in a Neon-no-VFP core that ID register field will be non-zero.
     */
    if (!dc_isar_feature(aa32_simdfmac, s) ||
        !dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }
    /*
     * In v7A, UNPREDICTABLE with non-zero vector length/stride; from
     * v8A, must UNDEF. We choose to UNDEF for both v7A and v8A.
     */
    if (s->vec_len != 0 || s->vec_stride != 0) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) &&
        ((a->vd | a->vn | a->vm) & 0x10)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) &&
        ((a->vd | a->vn | a->vm) & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    vn = tcg_temp_new_i64(tcg_ctx);
    vm = tcg_temp_new_i64(tcg_ctx);
    vd = tcg_temp_new_i64(tcg_ctx);

    neon_load_reg64(tcg_ctx, vn, a->vn);
    neon_load_reg64(tcg_ctx, vm, a->vm);
    if (neg_n) {
        /* VFNMS, VFMS */
        gen_helper_vfp_negd(tcg_ctx, vn, vn);
    }
    neon_load_reg64(tcg_ctx, vd, a->vd);
    if (neg_d) {
        /* VFNMA, VFNMS */
        gen_helper_vfp_negd(tcg_ctx, vd, vd);
    }
    fpst = get_fpstatus_ptr(tcg_ctx, 0);
    gen_helper_vfp_muladdd(tcg_ctx, vd, vn, vm, vd, fpst);
    neon_store_reg64(tcg_ctx, vd, a->vd);

    tcg_temp_free_ptr(tcg_ctx, fpst);
    tcg_temp_free_i64(tcg_ctx, vn);
    tcg_temp_free_i64(tcg_ctx, vm);
    tcg_temp_free_i64(tcg_ctx, vd);

    return true;
}